

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::UniformCase::assignUniforms
          (UniformCase *this,
          vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
          *basicUniforms,deUint32 programGL,Random *rnd)

{
  pointer pBVar1;
  pointer pcVar2;
  ulong uVar3;
  pointer pVVar4;
  string *psVar5;
  GLint location;
  int iVar6;
  int iVar7;
  uint size;
  DataType DVar8;
  deUint32 dVar9;
  GLenum GVar10;
  pointer pBVar11;
  long *plVar12;
  undefined8 *puVar13;
  char *pcVar14;
  size_t sVar15;
  bool bVar16;
  DataType scalarType;
  uint uVar17;
  int iVar18;
  ulong *puVar19;
  long *plVar20;
  long lVar21;
  VarValue *value;
  VarValue *value_00;
  GLsizei GVar22;
  pointer pBVar23;
  ulong uVar24;
  VarValue *pVVar25;
  DataType *pDVar26;
  undefined8 uVar27;
  DataType *pDVar28;
  _Alloc_hider _Var29;
  uint uVar30;
  CallLogWrapper *this_00;
  byte bVar31;
  float fVar32;
  string curName;
  vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
  valuesToAssign;
  string queryName;
  VarValue result_2;
  vector<float,_std::allocator<float>_> buffer;
  VarValue apiValue;
  long *local_3b8;
  long local_3b0;
  long local_3a8;
  long lStack_3a0;
  long *local_398;
  undefined8 local_390;
  long local_388;
  undefined8 uStack_380;
  TestLog *local_378;
  ulong *local_370;
  long local_368;
  ulong local_360;
  long lStack_358;
  deUint32 local_350;
  uint local_34c;
  vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
  local_348;
  ulong *local_328;
  long local_320;
  ulong local_318 [2];
  CallLogWrapper *local_308;
  deRandom *local_300;
  long *local_2f8 [2];
  long local_2e8 [2];
  string local_2d8;
  long local_2b8;
  undefined8 *local_2b0;
  string *local_2a8;
  long *local_2a0 [2];
  long local_290 [2];
  string local_280 [2];
  undefined1 local_238 [8];
  undefined1 local_230 [104];
  ios_base local_1c8 [8];
  ios_base local_1c0 [264];
  undefined1 local_b8 [4];
  anon_union_64_4_c5021b54_for_val local_b4;
  DataType local_74;
  float local_70 [16];
  
  bVar31 = 0;
  local_34c = *(uint *)&(this->super_CallLogWrapper).field_0x14;
  scalarType = TYPE_INT;
  if ((local_34c & 0x20) == 0) {
    scalarType = TYPE_FLOAT;
  }
  pBVar11 = (basicUniforms->
            super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(basicUniforms->
                              super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar11) >> 3) *
          0x286bca1b) {
    local_378 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = &this->super_CallLogWrapper;
    local_2b8 = 0;
    local_350 = programGL;
    local_308 = this_00;
    local_300 = &rnd->m_rnd;
    do {
      pBVar1 = pBVar11 + local_2b8;
      iVar18 = pBVar11[local_2b8].elemNdx;
      if ((((this->super_CallLogWrapper).field_0x14 & 0x80) == 0) ||
         (pBVar11[local_2b8].elemNdx != 0)) {
        local_2f8[0] = local_2e8;
        pcVar2 = (pBVar1->name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2f8,pcVar2,pcVar2 + (pBVar1->name)._M_string_length);
      }
      else {
        std::__cxx11::string::rfind((char)pBVar1,0x5b);
        std::__cxx11::string::substr((ulong)local_2f8,(ulong)pBVar1);
      }
      uVar17 = 1;
      if (-1 < iVar18) {
        uVar30 = *(uint *)&(this->super_CallLogWrapper).field_0x14;
        if ((uVar30 & 4) == 0) {
          if ((uVar30 & 8) != 0) {
            uVar17 = ~pBVar1->elemNdx * 2 & 2;
          }
        }
        else {
          uVar17 = 0;
          if (pBVar1->elemNdx == 0) {
            uVar17 = pBVar1->rootSize;
          }
        }
      }
      if (uVar17 == 0) {
        local_238 = (undefined1  [8])local_378;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"// Uniform ",0xb);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_230,(pBVar1->name)._M_dataplus._M_p,
                   (pBVar1->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_230,
                   " is covered by another glUniform*v() call to the same array",0x3b);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_238,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
        std::ios_base::~ios_base(local_1c0);
      }
      else {
        location = glu::CallLogWrapper::glGetUniformLocation
                             (this_00,local_350,(GLchar *)local_2f8[0]);
        iVar6 = glu::getDataTypeScalarSize(pBVar1->type);
        if (((this->super_CallLogWrapper).field_0x14 & 2) == 0) {
          bVar16 = false;
        }
        else {
          bVar16 = uVar17 == 1 &&
                   (pBVar1->type - TYPE_INT < 0xfffffff7 && pBVar1->type - TYPE_DOUBLE < 0xfffffff7)
          ;
        }
        local_348.
        super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_348.
        super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_348.
        super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (0 < (int)uVar17) {
          local_2a8 = &pBVar1->rootName;
          local_2b0 = (undefined8 *)((long)&(pBVar1->finalValue).val + 4);
          uVar30 = 0;
          do {
            psVar5 = local_2a8;
            if (iVar18 < 0) {
              local_3b8 = &local_3a8;
              pcVar2 = (pBVar1->name)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_3b8,pcVar2,pcVar2 + (pBVar1->name)._M_string_length);
            }
            else {
              std::__cxx11::string::rfind((char)local_2a8,0x5b);
              std::__cxx11::string::substr((ulong)local_2a0,(ulong)psVar5);
              plVar12 = (long *)std::__cxx11::string::append((char *)local_2a0);
              local_370 = &local_360;
              puVar19 = (ulong *)(plVar12 + 2);
              if ((ulong *)*plVar12 == puVar19) {
                local_360 = *puVar19;
                lStack_358 = plVar12[3];
              }
              else {
                local_360 = *puVar19;
                local_370 = (ulong *)*plVar12;
              }
              local_368 = plVar12[1];
              *plVar12 = (long)puVar19;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              iVar7 = pBVar1->elemNdx;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
              std::ostream::operator<<((ostringstream *)local_238,iVar7 + uVar30);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
              std::ios_base::~ios_base(local_1c8);
              uVar24 = 0xf;
              if (local_370 != &local_360) {
                uVar24 = local_360;
              }
              if (uVar24 < (ulong)(local_320 + local_368)) {
                uVar24 = 0xf;
                if (local_328 != local_318) {
                  uVar24 = local_318[0];
                }
                if (uVar24 < (ulong)(local_320 + local_368)) goto LAB_00f8d18a;
                puVar13 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_328,0,(char *)0x0,(ulong)local_370);
              }
              else {
LAB_00f8d18a:
                puVar13 = (undefined8 *)
                          std::__cxx11::string::_M_append((char *)&local_370,(ulong)local_328);
              }
              local_398 = &local_388;
              plVar12 = puVar13 + 2;
              if ((long *)*puVar13 == plVar12) {
                local_388 = *plVar12;
                uStack_380 = puVar13[3];
              }
              else {
                local_388 = *plVar12;
                local_398 = (long *)*puVar13;
              }
              local_390 = puVar13[1];
              *puVar13 = plVar12;
              puVar13[1] = 0;
              *(undefined1 *)plVar12 = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&local_398);
              local_3b8 = &local_3a8;
              plVar20 = plVar12 + 2;
              if ((long *)*plVar12 == plVar20) {
                local_3a8 = *plVar20;
                lStack_3a0 = plVar12[3];
              }
              else {
                local_3a8 = *plVar20;
                local_3b8 = (long *)*plVar12;
              }
              local_3b0 = plVar12[1];
              *plVar12 = (long)plVar20;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
            }
            pBVar11 = pBVar1;
            if (iVar18 < 0) {
LAB_00f8d328:
              pVVar25 = &pBVar11->finalValue;
              pDVar26 = &local_74;
              for (lVar21 = 0x11; lVar21 != 0; lVar21 = lVar21 + -1) {
                *pDVar26 = pVVar25->type;
                pVVar25 = (VarValue *)((long)pVVar25 + (ulong)bVar31 * -8 + 4);
                pDVar26 = pDVar26 + (ulong)bVar31 * -2 + 1;
              }
              if (local_74 - TYPE_BOOL < 4) {
                size = glu::getDataTypeScalarSize(local_74);
                DVar8 = scalarType;
                if (size != 1) {
                  DVar8 = glu::getDataTypeVector(scalarType,size);
                }
                local_b8 = (undefined1  [4])DVar8;
                if ((local_34c & 0x20) == 0) {
                  if (0 < (int)size) {
                    uVar24 = 0;
                    do {
                      if (*(char *)((long)local_70 + uVar24) == '\x01') {
                        fVar32 = deRandom_getFloat(local_300);
                        fVar32 = fVar32 * 20.0 + -10.0;
                        *(float *)((long)&local_b4 + uVar24 * 4) = fVar32;
                        if ((fVar32 == 0.0) && (!NAN(fVar32))) {
                          *(undefined4 *)((long)&local_b4 + uVar24 * 4) = 0x3f800000;
                        }
                      }
                      else {
                        *(undefined4 *)((long)&local_b4 + uVar24 * 4) = 0;
                      }
                      uVar24 = uVar24 + 1;
                    } while (size != uVar24);
                  }
                }
                else if (0 < (int)size) {
                  uVar24 = 0;
                  do {
                    if (*(char *)((long)local_70 + uVar24) == '\x01') {
                      dVar9 = deRandom_getUint32(local_300);
                      *(uint *)((long)&local_b4 + uVar24 * 4) =
                           (dVar9 % 0x15 - 10) + (uint)(dVar9 % 0x15 == 10);
                    }
                    else {
                      *(undefined4 *)((long)&local_b4 + uVar24 * 4) = 0;
                    }
                    uVar24 = uVar24 + 1;
                  } while (size != uVar24);
                }
              }
              else if (local_74 - TYPE_SAMPLER_1D < 0x1e) {
                local_b8 = (undefined1  [4])0x1b;
                local_b4.floatV[0] = local_70[0];
              }
              else {
                pDVar26 = &local_74;
                pDVar28 = (DataType *)local_b8;
                for (lVar21 = 0x11; lVar21 != 0; lVar21 = lVar21 + -1) {
                  *pDVar28 = *pDVar26;
                  pDVar26 = pDVar26 + (ulong)bVar31 * -2 + 1;
                  pDVar28 = pDVar28 + (ulong)bVar31 * -2 + 1;
                }
              }
              std::
              vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
              ::push_back(&local_348,(value_type *)local_b8);
              if (pBVar1->type - TYPE_BOOL < 4) {
                local_238 = (undefined1  [8])local_378;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_230,"// Using type ",0xe);
                pcVar14 = glu::getDataTypeName(scalarType);
                if (pcVar14 == (char *)0x0) {
                  std::ios::clear((int)local_230 + (int)*(_func_int **)(local_230._0_8_ + -0x18));
                }
                else {
                  sVar15 = strlen(pcVar14);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_230,pcVar14,sVar15);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_230," to set boolean value ",0x16);
                apiVarValueStr_abi_cxx11_(local_280,(Functional *)&local_74,value_00);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_230,
                           (char *)CONCAT44(local_280[0]._M_dataplus._M_p._4_4_,
                                            local_280[0]._M_dataplus._M_p._0_4_),
                           CONCAT44(local_280[0]._M_string_length._4_4_,
                                    (undefined4)local_280[0]._M_string_length));
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230," for ",5);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_230,(char *)local_3b8,local_3b0);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_238,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_280[0]._M_dataplus._M_p._4_4_,
                                local_280[0]._M_dataplus._M_p._0_4_) != &local_280[0].field_2) {
                  uVar27 = CONCAT44(local_280[0].field_2._M_allocated_capacity._4_4_,
                                    (undefined4)local_280[0].field_2._M_allocated_capacity);
                  _Var29._M_p = (char *)CONCAT44(local_280[0]._M_dataplus._M_p._4_4_,
                                                 local_280[0]._M_dataplus._M_p._0_4_);
LAB_00f8d6df:
                  operator_delete(_Var29._M_p,uVar27 + 1);
                }
              }
              else {
                if (0x1d < pBVar1->type - TYPE_SAMPLER_1D) goto LAB_00f8d708;
                local_238 = (undefined1  [8])local_378;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_230,"// Texture for the sampler uniform ",0x23);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_230,(char *)local_3b8,local_3b0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_230," will be filled with color ",0x1b);
                local_280[0]._M_dataplus._M_p._0_4_ = 4;
                local_280[0]._M_dataplus._M_p._4_4_ = (undefined4)*local_2b0;
                local_280[0]._M_string_length._0_4_ = (undefined4)((ulong)*local_2b0 >> 0x20);
                local_280[0]._M_string_length._4_4_ = (undefined4)local_2b0[1];
                local_280[0].field_2._M_allocated_capacity._0_4_ =
                     (undefined4)((ulong)local_2b0[1] >> 0x20);
                apiVarValueStr_abi_cxx11_(&local_2d8,(Functional *)local_280,value);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_230,local_2d8._M_dataplus._M_p,
                           local_2d8._M_string_length);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_238,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                uVar27 = local_2d8.field_2._M_allocated_capacity;
                _Var29._M_p = local_2d8._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) goto LAB_00f8d6df;
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
              std::ios_base::~ios_base(local_1c0);
            }
            else {
              if (local_398 != &local_388) {
                operator_delete(local_398,local_388 + 1);
              }
              if (local_328 != local_318) {
                operator_delete(local_328,local_318[0] + 1);
              }
              if (iVar18 < 0) goto LAB_00f8d328;
              if (local_370 != &local_360) {
                operator_delete(local_370,local_360 + 1);
              }
              if (local_2a0[0] != local_290) {
                operator_delete(local_2a0[0],local_290[0] + 1);
              }
              pBVar23 = (basicUniforms->
                        super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              pBVar11 = (basicUniforms->
                        super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
              if (pBVar23 != pBVar11) {
                do {
                  iVar7 = std::__cxx11::string::compare((char *)pBVar23);
                  pBVar11 = pBVar23;
                  if (iVar7 == 0) break;
                  pBVar23 = pBVar23 + 1;
                  pBVar11 = (basicUniforms->
                            super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                            )._M_impl.super__Vector_impl_data._M_finish;
                } while (pBVar23 != pBVar11);
              }
              if (pBVar11 !=
                  (basicUniforms->
                  super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                  )._M_impl.super__Vector_impl_data._M_finish) goto LAB_00f8d328;
            }
LAB_00f8d708:
            if (local_3b8 != &local_3a8) {
              operator_delete(local_3b8,local_3a8 + 1);
            }
            uVar30 = uVar30 + 1;
          } while (uVar30 != uVar17);
        }
        this_00 = local_308;
        pVVar4 = local_348.
                 super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        DVar8 = (local_348.
                 super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                 ._M_impl.super__Vector_impl_data._M_start)->type;
        if (DVar8 - TYPE_FLOAT < 4) {
          if (bVar16) {
            switch(iVar6) {
            case 1:
              glu::CallLogWrapper::glUniform1f
                        (local_308,location,
                         ((local_348.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[0]);
              dVar9 = glu::CallLogWrapper::glGetError(this_00);
              iVar18 = 0x60a;
              pcVar14 = "glUniform1f(location, ptr[0])";
              break;
            case 2:
              glu::CallLogWrapper::glUniform2f
                        (local_308,location,
                         ((local_348.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[0],
                         ((local_348.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[1]);
              dVar9 = glu::CallLogWrapper::glGetError(this_00);
              iVar18 = 0x60b;
              pcVar14 = "glUniform2f(location, ptr[0], ptr[1])";
              break;
            case 3:
              glu::CallLogWrapper::glUniform3f
                        (local_308,location,
                         ((local_348.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[0],
                         ((local_348.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[1],
                         ((local_348.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[2]);
              dVar9 = glu::CallLogWrapper::glGetError(this_00);
              iVar18 = 0x60c;
              pcVar14 = "glUniform3f(location, ptr[0], ptr[1], ptr[2])";
              break;
            case 4:
              glu::CallLogWrapper::glUniform4f
                        (local_308,location,
                         ((local_348.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[0],
                         ((local_348.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[1],
                         ((local_348.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[2],
                         ((local_348.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[3]);
              dVar9 = glu::CallLogWrapper::glGetError(this_00);
              iVar18 = 0x60d;
              pcVar14 = "glUniform4f(location, ptr[0], ptr[1], ptr[2], ptr[3])";
              break;
            default:
              goto switchD_00f8d77c_default;
            }
            glu::checkError(dVar9,pcVar14,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                            ,iVar18);
            goto switchD_00f8d77c_default;
          }
          lVar21 = ((long)local_348.
                          super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_348.
                          super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 2) * -0xf0f0f0f0f0f0f0f;
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)local_238,iVar6 * lVar21,
                     (allocator_type *)&local_74);
          uVar17 = (uint)((ulong)(local_230._0_8_ - (long)local_238) >> 2);
          if (0 < (int)uVar17) {
            uVar24 = 0;
            do {
              uVar3 = (ulong)(uint)((int)uVar24 >> 0x1f) << 0x20 | uVar24 & 0xffffffff;
              *(float *)((long)(qpTestLog **)local_238 + uVar24 * 4) =
                   pVVar4[(int)((long)uVar3 / (long)iVar6)].val.floatV
                   [(int)((long)uVar3 % (long)iVar6)];
              uVar24 = uVar24 + 1;
            } while ((uVar17 & 0x7fffffff) != uVar24);
          }
          GVar22 = (GLsizei)lVar21;
          switch(iVar6) {
          case 1:
            glu::CallLogWrapper::glUniform1fv(this_00,location,GVar22,(GLfloat *)local_238);
            dVar9 = glu::CallLogWrapper::glGetError(this_00);
            iVar18 = 0x61b;
            pcVar14 = "glUniform1fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])";
            break;
          case 2:
            glu::CallLogWrapper::glUniform2fv(this_00,location,GVar22,(GLfloat *)local_238);
            dVar9 = glu::CallLogWrapper::glGetError(this_00);
            iVar18 = 0x61c;
            pcVar14 = "glUniform2fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])";
            break;
          case 3:
            glu::CallLogWrapper::glUniform3fv(this_00,location,GVar22,(GLfloat *)local_238);
            dVar9 = glu::CallLogWrapper::glGetError(this_00);
            iVar18 = 0x61d;
            pcVar14 = "glUniform3fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])";
            break;
          case 4:
            glu::CallLogWrapper::glUniform4fv(this_00,location,GVar22,(GLfloat *)local_238);
            dVar9 = glu::CallLogWrapper::glGetError(this_00);
            iVar18 = 0x61e;
            pcVar14 = "glUniform4fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])";
            break;
          default:
            goto switchD_00f8d94e_default;
          }
          glu::checkError(dVar9,pcVar14,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                          ,iVar18);
switchD_00f8d94e_default:
          if (local_238 != (undefined1  [8])0x0) {
            operator_delete((void *)local_238,local_230._8_8_ - (long)local_238);
          }
        }
        else {
          if (DVar8 - TYPE_FLOAT_MAT2 < 9 || DVar8 - TYPE_DOUBLE_MAT2 < 9) {
            lVar21 = ((long)local_348.
                            super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_348.
                            super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * -0xf0f0f0f0f0f0f0f;
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)local_238,iVar6 * lVar21,
                       (allocator_type *)&local_74);
            uVar17 = (uint)((ulong)(local_230._0_8_ - (long)local_238) >> 2);
            if (0 < (int)uVar17) {
              uVar24 = 0;
              do {
                uVar3 = (ulong)(uint)((int)uVar24 >> 0x1f) << 0x20 | uVar24 & 0xffffffff;
                *(float *)((long)(qpTestLog **)local_238 + uVar24 * 4) =
                     pVVar4[(int)((long)uVar3 / (long)iVar6)].val.floatV
                     [(int)((long)uVar3 % (long)iVar6)];
                uVar24 = uVar24 + 1;
              } while ((uVar17 & 0x7fffffff) != uVar24);
            }
            DVar8 = pBVar1->type;
            GVar22 = (GLsizei)lVar21;
            if (DVar8 == TYPE_FLOAT_MAT2) {
              glu::CallLogWrapper::glUniformMatrix2fv
                        (this_00,location,GVar22,'\0',(GLfloat *)local_238);
              dVar9 = glu::CallLogWrapper::glGetError(this_00);
              iVar18 = 0x62e;
              pcVar14 = 
              "glUniformMatrix2fv(location, (GLsizei)valuesToAssign.size(), GL_FALSE, &buffer[0])";
            }
            else if (DVar8 == TYPE_FLOAT_MAT3) {
              glu::CallLogWrapper::glUniformMatrix3fv
                        (this_00,location,GVar22,'\0',(GLfloat *)local_238);
              dVar9 = glu::CallLogWrapper::glGetError(this_00);
              iVar18 = 0x62f;
              pcVar14 = 
              "glUniformMatrix3fv(location, (GLsizei)valuesToAssign.size(), GL_FALSE, &buffer[0])";
            }
            else {
              if (DVar8 != TYPE_FLOAT_MAT4) goto switchD_00f8d94e_default;
              glu::CallLogWrapper::glUniformMatrix4fv
                        (this_00,location,GVar22,'\0',(GLfloat *)local_238);
              dVar9 = glu::CallLogWrapper::glGetError(this_00);
              iVar18 = 0x630;
              pcVar14 = 
              "glUniformMatrix4fv(location, (GLsizei)valuesToAssign.size(), GL_FALSE, &buffer[0])";
            }
            glu::checkError(dVar9,pcVar14,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                            ,iVar18);
            goto switchD_00f8d94e_default;
          }
          if (DVar8 - TYPE_INT < 4) {
            if (!bVar16) {
              lVar21 = ((long)local_348.
                              super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_348.
                              super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0xf0f0f0f0f0f0f0f;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)local_238,iVar6 * lVar21,
                         (allocator_type *)&local_74);
              uVar17 = (uint)((ulong)(local_230._0_8_ - (long)local_238) >> 2);
              if (0 < (int)uVar17) {
                uVar24 = 0;
                do {
                  uVar3 = (ulong)(uint)((int)uVar24 >> 0x1f) << 0x20 | uVar24 & 0xffffffff;
                  *(float *)((long)(qpTestLog **)local_238 + uVar24 * 4) =
                       pVVar4[(int)((long)uVar3 / (long)iVar6)].val.floatV
                       [(int)((long)uVar3 % (long)iVar6)];
                  uVar24 = uVar24 + 1;
                } while ((uVar17 & 0x7fffffff) != uVar24);
              }
              GVar22 = (GLsizei)lVar21;
              switch(iVar6) {
              case 1:
                glu::CallLogWrapper::glUniform1iv(this_00,location,GVar22,(GLint *)local_238);
                dVar9 = glu::CallLogWrapper::glGetError(this_00);
                iVar18 = 0x64e;
                pcVar14 = "glUniform1iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])";
                break;
              case 2:
                glu::CallLogWrapper::glUniform2iv(this_00,location,GVar22,(GLint *)local_238);
                dVar9 = glu::CallLogWrapper::glGetError(this_00);
                iVar18 = 0x64f;
                pcVar14 = "glUniform2iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])";
                break;
              case 3:
                glu::CallLogWrapper::glUniform3iv(this_00,location,GVar22,(GLint *)local_238);
                dVar9 = glu::CallLogWrapper::glGetError(this_00);
                iVar18 = 0x650;
                pcVar14 = "glUniform3iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])";
                break;
              case 4:
                glu::CallLogWrapper::glUniform4iv(this_00,location,GVar22,(GLint *)local_238);
                dVar9 = glu::CallLogWrapper::glGetError(this_00);
                iVar18 = 0x651;
                pcVar14 = "glUniform4iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])";
                break;
              default:
                goto switchD_00f8d94e_default;
              }
              glu::checkError(dVar9,pcVar14,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                              ,iVar18);
              goto switchD_00f8d94e_default;
            }
            switch(iVar6) {
            case 1:
              glu::CallLogWrapper::glUniform1i
                        (local_308,location,
                         ((local_348.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[0]);
              dVar9 = glu::CallLogWrapper::glGetError(this_00);
              iVar18 = 0x63d;
              pcVar14 = "glUniform1i(location, ptr[0])";
              break;
            case 2:
              glu::CallLogWrapper::glUniform2i
                        (local_308,location,
                         ((local_348.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[0],
                         ((local_348.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[1]);
              dVar9 = glu::CallLogWrapper::glGetError(this_00);
              iVar18 = 0x63e;
              pcVar14 = "glUniform2i(location, ptr[0], ptr[1])";
              break;
            case 3:
              glu::CallLogWrapper::glUniform3i
                        (local_308,location,
                         ((local_348.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[0],
                         ((local_348.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[1],
                         ((local_348.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[2]);
              dVar9 = glu::CallLogWrapper::glGetError(this_00);
              iVar18 = 0x63f;
              pcVar14 = "glUniform3i(location, ptr[0], ptr[1], ptr[2])";
              break;
            case 4:
              glu::CallLogWrapper::glUniform4i
                        (local_308,location,
                         ((local_348.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[0],
                         ((local_348.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[1],
                         ((local_348.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[2],
                         ((local_348.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[3]);
              dVar9 = glu::CallLogWrapper::glGetError(this_00);
              iVar18 = 0x640;
              pcVar14 = "glUniform4i(location, ptr[0], ptr[1], ptr[2], ptr[3])";
              break;
            default:
              goto switchD_00f8d77c_default;
            }
            glu::checkError(dVar9,pcVar14,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                            ,iVar18);
          }
          else if (DVar8 - TYPE_SAMPLER_1D < 0x1e) {
            if (bVar16) {
              glu::CallLogWrapper::glUniform1i(local_308,location,(pBVar1->finalValue).val.intV[0]);
              GVar10 = glu::CallLogWrapper::glGetError(this_00);
              glu::checkError(GVar10,"glUniform1i(location, uniform.finalValue.val.samplerV.unit)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                              ,0x65a);
            }
            else {
              local_238._0_4_ = (pBVar1->finalValue).val.intV[0];
              glu::CallLogWrapper::glUniform1iv
                        (local_308,location,
                         (int)((ulong)((long)local_348.
                                             super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_348.
                                            super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                         -0xf0f0f0f,(GLint *)local_238);
              GVar10 = glu::CallLogWrapper::glGetError(this_00);
              glu::checkError(GVar10,"glUniform1iv(location, (GLsizei)valuesToAssign.size(), &unit)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                              ,0x65e);
            }
          }
        }
switchD_00f8d77c_default:
        operator_delete(pVVar4,(long)local_348.
                                     super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pVVar4);
      }
      if (local_2f8[0] != local_2e8) {
        operator_delete(local_2f8[0],local_2e8[0] + 1);
      }
      local_2b8 = local_2b8 + 1;
      pBVar11 = (basicUniforms->
                super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (local_2b8 <
             (int)((ulong)((long)(basicUniforms->
                                 super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar11) >> 3)
             * 0x286bca1b);
  }
  return;
}

Assistant:

void UniformCase::assignUniforms (const vector<BasicUniform>& basicUniforms, deUint32 programGL, Random& rnd)
{
	TestLog&				log				= m_testCtx.getLog();
	const glu::DataType		boolApiType		= m_features & FEATURE_BOOLEANAPITYPE_INT	? glu::TYPE_INT
											:											  glu::TYPE_FLOAT;

	for (int unifNdx = 0; unifNdx < (int)basicUniforms.size(); unifNdx++)
	{
		const BasicUniform&		uniform				= basicUniforms[unifNdx];
		const bool				isArrayMember		= uniform.elemNdx >= 0;
		const string			queryName			= m_features & FEATURE_ARRAY_FIRST_ELEM_NAME_NO_INDEX && uniform.elemNdx == 0 ? beforeLast(uniform.name, '[') : uniform.name;
		const int				numValuesToAssign	= !isArrayMember									? 1
													: m_features & FEATURE_ARRAYASSIGN_FULL				? (uniform.elemNdx == 0			? uniform.rootSize	: 0)
													: m_features & FEATURE_ARRAYASSIGN_BLOCKS_OF_TWO	? (uniform.elemNdx % 2 == 0		? 2					: 0)
													: /* Default: assign array elements separately */	  1;

		DE_ASSERT(numValuesToAssign >= 0);
		DE_ASSERT(numValuesToAssign == 1 || isArrayMember);

		if (numValuesToAssign == 0)
		{
			log << TestLog::Message << "// Uniform " << uniform.name << " is covered by another glUniform*v() call to the same array" << TestLog::EndMessage;
			continue;
		}

		const int			location			= glGetUniformLocation(programGL, queryName.c_str());
		const int			typeSize			= glu::getDataTypeScalarSize(uniform.type);
		const bool			assignByValue		= m_features & FEATURE_UNIFORMFUNC_VALUE && !glu::isDataTypeMatrix(uniform.type) && numValuesToAssign == 1;
		vector<VarValue>	valuesToAssign;

		for (int i = 0; i < numValuesToAssign; i++)
		{
			const string	curName = isArrayMember ? beforeLast(uniform.rootName, '[') + "[" + de::toString(uniform.elemNdx+i) + "]" : uniform.name;
			VarValue		unifValue;

			if (isArrayMember)
			{
				const vector<BasicUniform>::const_iterator elemUnif = BasicUniform::findWithName(basicUniforms, curName.c_str());
				if (elemUnif == basicUniforms.end())
					continue;
				unifValue = elemUnif->finalValue;
			}
			else
				unifValue = uniform.finalValue;

			const VarValue apiValue = glu::isDataTypeBoolOrBVec(unifValue.type)	? getRandomBoolRepresentation(unifValue, boolApiType, rnd)
									: glu::isDataTypeSampler(unifValue.type)	? getSamplerUnitValue(unifValue)
									: unifValue;

			valuesToAssign.push_back(apiValue);

			if (glu::isDataTypeBoolOrBVec(uniform.type))
				log << TestLog::Message << "// Using type " << glu::getDataTypeName(boolApiType) << " to set boolean value " << apiVarValueStr(unifValue) << " for " << curName << TestLog::EndMessage;
			else if (glu::isDataTypeSampler(uniform.type))
				log << TestLog::Message << "// Texture for the sampler uniform " << curName << " will be filled with color " << apiVarValueStr(getSamplerFillValue(uniform.finalValue)) << TestLog::EndMessage;
		}

		DE_ASSERT(!valuesToAssign.empty());

		if (glu::isDataTypeFloatOrVec(valuesToAssign[0].type))
		{
			if (assignByValue)
			{
				const float* const ptr = &valuesToAssign[0].val.floatV[0];

				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glUniform1f(location, ptr[0]));							break;
					case 2: GLU_CHECK_CALL(glUniform2f(location, ptr[0], ptr[1]));					break;
					case 3: GLU_CHECK_CALL(glUniform3f(location, ptr[0], ptr[1], ptr[2]));			break;
					case 4: GLU_CHECK_CALL(glUniform4f(location, ptr[0], ptr[1], ptr[2], ptr[3]));	break;
					default:
						DE_ASSERT(false);
				}
			}
			else
			{
				vector<float> buffer(valuesToAssign.size() * typeSize);
				for (int i = 0; i < (int)buffer.size(); i++)
					buffer[i] = valuesToAssign[i / typeSize].val.floatV[i % typeSize];

				DE_STATIC_ASSERT(sizeof(GLfloat) == sizeof(buffer[0]));
				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glUniform1fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 2: GLU_CHECK_CALL(glUniform2fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 3: GLU_CHECK_CALL(glUniform3fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 4: GLU_CHECK_CALL(glUniform4fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					default:
						DE_ASSERT(false);
				}
			}
		}
		else if (glu::isDataTypeMatrix(valuesToAssign[0].type))
		{
			DE_ASSERT(!assignByValue);

			vector<float> buffer(valuesToAssign.size() * typeSize);
			for (int i = 0; i < (int)buffer.size(); i++)
				buffer[i] = valuesToAssign[i / typeSize].val.floatV[i % typeSize];

			switch (uniform.type)
			{
				case glu::TYPE_FLOAT_MAT2: GLU_CHECK_CALL(glUniformMatrix2fv(location, (GLsizei)valuesToAssign.size(), GL_FALSE, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT3: GLU_CHECK_CALL(glUniformMatrix3fv(location, (GLsizei)valuesToAssign.size(), GL_FALSE, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT4: GLU_CHECK_CALL(glUniformMatrix4fv(location, (GLsizei)valuesToAssign.size(), GL_FALSE, &buffer[0])); break;
				default:
					DE_ASSERT(false);
			}
		}
		else if (glu::isDataTypeIntOrIVec(valuesToAssign[0].type))
		{
			if (assignByValue)
			{
				const deInt32* const ptr = &valuesToAssign[0].val.intV[0];

				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glUniform1i(location, ptr[0]));							break;
					case 2: GLU_CHECK_CALL(glUniform2i(location, ptr[0], ptr[1]));					break;
					case 3: GLU_CHECK_CALL(glUniform3i(location, ptr[0], ptr[1], ptr[2]));			break;
					case 4: GLU_CHECK_CALL(glUniform4i(location, ptr[0], ptr[1], ptr[2], ptr[3]));	break;
					default:
						DE_ASSERT(false);
				}
			}
			else
			{
				vector<deInt32> buffer(valuesToAssign.size() * typeSize);
				for (int i = 0; i < (int)buffer.size(); i++)
					buffer[i] = valuesToAssign[i / typeSize].val.intV[i % typeSize];

				DE_STATIC_ASSERT(sizeof(GLint) == sizeof(buffer[0]));
				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glUniform1iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 2: GLU_CHECK_CALL(glUniform2iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 3: GLU_CHECK_CALL(glUniform3iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 4: GLU_CHECK_CALL(glUniform4iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					default:
						DE_ASSERT(false);
				}
			}
		}
		else if (glu::isDataTypeSampler(valuesToAssign[0].type))
		{
			if (assignByValue)
				GLU_CHECK_CALL(glUniform1i(location, uniform.finalValue.val.samplerV.unit));
			else
			{
				const GLint unit = uniform.finalValue.val.samplerV.unit;
				GLU_CHECK_CALL(glUniform1iv(location, (GLsizei)valuesToAssign.size(), &unit));
			}
		}
		else
			DE_ASSERT(false);
	}
}